

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonotope.cpp
# Opt level: O1

uint readFile(char *filename,
             vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *star)

{
  bool bVar1;
  void *pvVar2;
  char cVar3;
  istream *piVar4;
  double *pdVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  VectorXd v;
  string linestr;
  vector<double,_std::allocator<double>_> line;
  ifstream input;
  istringstream buffer;
  value_type local_438;
  undefined1 *local_428;
  undefined8 local_420;
  undefined1 local_418 [16];
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *local_408;
  void *local_400;
  long local_3f8;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_3e8;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_3d0;
  long local_3b8 [65];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_408 = star;
  std::ifstream::ifstream(local_3b8,filename,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    uVar7 = 0;
    printf("Could not open or find file: %s\n",filename);
  }
  else {
    local_428 = local_418;
    local_420 = 0;
    local_418[0] = 0;
    cVar3 = std::ios::widen((char)local_3b8 + (char)*(undefined8 *)(local_3b8[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_3b8,(string *)&local_428,cVar3);
    cVar3 = std::ios::widen((char)(istream *)local_3b8 + (char)*(undefined8 *)(local_3b8[0] + -0x18)
                           );
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_3b8,(string *)&local_428,cVar3);
    cVar3 = std::ios::widen((char)(istream *)local_3b8 + (char)*(undefined8 *)(local_3b8[0] + -0x18)
                           );
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_3b8,(string *)&local_428,cVar3);
    uVar7 = 0;
    do {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_3b8[0] + -0x18) +
                              (char)(istream *)local_3b8);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3b8,(string *)&local_428,cVar3);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
        std::ifstream::close();
        goto LAB_00107081;
      }
      std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_428,_S_in);
      local_3d0._M_ok = true;
      local_3d0._M_stream = (istream_type *)local_1b0;
      std::istream_iterator<double,_char,_std::char_traits<char>,_long>::_M_read(&local_3d0);
      local_3e8._M_stream = (istream_type *)0x0;
      local_3e8._M_value = 0.0;
      local_3e8._M_ok = false;
      std::vector<double,std::allocator<double>>::
      vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
                ((vector<double,std::allocator<double>> *)&local_400,&local_3d0,&local_3e8,
                 (allocator_type *)&local_438);
      pvVar2 = local_400;
      if ((local_3f8 - (long)local_400 == 0) ||
         (uVar9 = local_3f8 - (long)local_400 >> 3, uVar9 != uVar7 && uVar7 != 0)) {
        puts("Malformed input file");
        std::ifstream::close();
        bVar1 = false;
      }
      else {
        uVar8 = uVar9 & 0xffffffff;
        if (uVar8 == 0) {
          pdVar5 = (double *)0x0;
        }
        else {
          pdVar5 = (double *)malloc(uVar8 * 8);
          if (pdVar5 == (double *)0x0) {
LAB_001070c7:
            puVar6 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar6 = operator_delete;
            __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
        }
        uVar7 = (uint)uVar9;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             pdVar5;
        local_438.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             uVar8;
        if (uVar7 != 0) {
          uVar8 = 0;
          do {
            if (uVar9 <= uVar8) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar8,uVar9);
              goto LAB_001070c7;
            }
            pdVar5[uVar8] = *(double *)((long)pvVar2 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (uVar7 != (uint)uVar8);
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(local_408,&local_438);
        free(local_438.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        bVar1 = true;
      }
      if (local_400 != (void *)0x0) {
        operator_delete(local_400);
      }
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
    } while (bVar1);
    uVar7 = 0;
LAB_00107081:
    if (local_428 != local_418) {
      operator_delete(local_428);
    }
  }
  std::ifstream::~ifstream(local_3b8);
  return uVar7;
}

Assistant:

unsigned int readFile(const char *filename, std::vector<Eigen::VectorXd> &star) {
	std::ifstream input(filename);

	if (!input.is_open()) {
		printf("Could not open or find file: %s\n", filename);
		return 0;
	}

	std::string linestr;
	unsigned int dim = 0;

	// skipping first 3 lines
	std::getline(input, linestr);
	std::getline(input, linestr);
	std::getline(input, linestr);

	while (std::getline(input, linestr)) {
		std::istringstream buffer(linestr);
		std::vector<double> line((std::istream_iterator<double>(buffer)), std::istream_iterator<double>());

		if ((line.size() < 1) || (dim && dim != line.size())) {
			printf("Malformed input file\n");
			input.close();
			return 0;
		}

		dim = (unsigned int)(line.size());
		Eigen::VectorXd v(dim);

		for (unsigned int i = 0; i < dim; i++)
			v[i] = line.at(i);

		star.push_back(v);
	}

	input.close();

	return dim;
}